

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

void cvSetEta(CVodeMem cv_mem)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = cv_mem->cv_eta;
  if ((dVar1 < cv_mem->cv_eta_min_fx || dVar1 == cv_mem->cv_eta_min_fx) ||
     (cv_mem->cv_eta_max_fx <= dVar1)) {
    if (cv_mem->cv_eta_max_fx <= dVar1) {
      if (cv_mem->cv_etamax <= dVar1) {
        dVar1 = cv_mem->cv_etamax;
      }
      dVar2 = cv_mem->cv_h;
      dVar4 = ABS(dVar2) * cv_mem->cv_hmax_inv * dVar1;
      dVar3 = 1.0;
      if (1.0 <= dVar4) {
        dVar3 = dVar4;
      }
      dVar1 = dVar1 / dVar3;
    }
    else {
      if (dVar1 <= cv_mem->cv_eta_min) {
        dVar1 = cv_mem->cv_eta_min;
      }
      dVar2 = cv_mem->cv_h;
      dVar3 = cv_mem->cv_hmin / ABS(dVar2);
      if (dVar1 <= dVar3) {
        dVar1 = dVar3;
      }
    }
    cv_mem->cv_eta = dVar1;
    cv_mem->cv_hprime = dVar2 * dVar1;
    if (cv_mem->cv_qprime < cv_mem->cv_q) {
      cv_mem->cv_nscon = 0;
      return;
    }
  }
  else {
    cv_mem->cv_eta = 1.0;
    cv_mem->cv_hprime = cv_mem->cv_h;
  }
  return;
}

Assistant:

static void cvSetEta(CVodeMem cv_mem)
{
  if ((cv_mem->cv_eta > cv_mem->cv_eta_min_fx) &&
      (cv_mem->cv_eta < cv_mem->cv_eta_max_fx))
  {
    /* Eta is within the fixed step bounds, retain step size */
    cv_mem->cv_eta = ONE;
    cv_mem->cv_hprime = cv_mem->cv_h;
  }
  else
  {
    if (cv_mem->cv_eta >= cv_mem->cv_eta_max_fx)
    {
      /* Increase the step size, limit eta by etamax and hmax */
      cv_mem->cv_eta = SUNMIN(cv_mem->cv_eta, cv_mem->cv_etamax);
      cv_mem->cv_eta /= SUNMAX(ONE, SUNRabs(cv_mem->cv_h) *
                               cv_mem->cv_hmax_inv * cv_mem->cv_eta);
    }
    else
    {
      /* Reduce the step size, limit eta by etamin and hmin */
      cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta, cv_mem->cv_eta_min);
      cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta, cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
    }
    /* Set hprime */
    cv_mem->cv_hprime = cv_mem->cv_h * cv_mem->cv_eta;
    if (cv_mem->cv_qprime < cv_mem->cv_q) cv_mem->cv_nscon = 0;
  }
}